

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

ssize_t __thiscall JetHead::Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  uint __i;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ssize_t sVar4;
  long lVar5;
  undefined4 in_register_00000034;
  timeval *__timeout;
  sockaddr *in_R9;
  ulong uVar6;
  socklen_t *in_stack_00000008;
  timeval timeout;
  fd_set readSet;
  
  timeout.tv_sec = (__time_t)(uint)this->mReadTimeout;
  if (timeout.tv_sec == 0) {
    if (this->mSockStream == false) {
      sVar4 = recvfrom(this,__fd,(void *)((ulong)__buf & 0xffffffff),
                       (size_t)&this->mLastDatagramSender,0,in_R9,in_stack_00000008);
      return sVar4;
    }
    uVar6 = ::read(this->mFd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf);
  }
  else {
    uVar6 = 0xffffffffffffffff;
    if (-1 < this->mReadTimeout) {
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        readSet.fds_bits[lVar5] = 0;
      }
      readSet.fds_bits[(uint)this->mFd >> 6] =
           readSet.fds_bits[(uint)this->mFd >> 6] | 1L << ((byte)this->mFd & 0x3f);
      timeout.tv_usec = 0;
      do {
        __timeout = (timeval *)&timeout;
        if (this->mReadTimeout == 0) {
          __timeout = (timeval *)0x0;
        }
        iVar1 = select(0x400,(fd_set *)&readSet,(fd_set *)0x0,(fd_set *)0x0,__timeout);
        if (iVar1 != -1) {
          if (iVar1 != 0) {
            uVar3 = recv(this->mFd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,
                         0x4000);
            uVar6 = 0xffffffff;
            if (-1 < (int)uVar3) {
              uVar6 = uVar3 & 0xffffffff;
            }
          }
          break;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
  }
  return uVar6 & 0xffffffff;
}

Assistant:

int Socket::read( void *buffer, int len )
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (mReadTimeout)
	{
		int retCode = 0;
		fd_set readSet;
		struct timeval timeout;
		int numBytes = 0;

		if( mReadTimeout < 0 ) 
		{
			return -1; // invalid timeout
		}

		FD_ZERO( &readSet );
		FD_SET( ( unsigned )mFd, &readSet );

		timeout.tv_sec = mReadTimeout;
		timeout.tv_usec = 0;

		while( true ) {
			if( mReadTimeout == 0 ) 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, NULL );
			} 
			else 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, &timeout );
			}

			if( retCode == 0 ) 
			{
				return -1; // timed out
			}
			if( retCode == -1 ) 
			{
				if( errno == EINTR )
					continue;
				
				return -1; // error
			} 
			else 
			{
				break; // continue with read 
			}
		}

		// read data
		numBytes = recv( mFd, buffer, len, MSG_NOSIGNAL );

		if( numBytes < 0 ) 
		{
			return -1; // socket error;
		}

		return numBytes;
	}
	else
	{
		if (not mSockStream)
		{
			return recvfrom(buffer, len, mLastDatagramSender);
		} else {
			return ::read(mFd, buffer, len);
		}
	}
}